

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::DeCompress_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,int length,int resetValue,
          GetNextCharFunc *func)

{
  int iVar1;
  wchar_t __c;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  wchar_t *pwVar5;
  double dVar6;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a0;
  allocator<wchar_t> local_179;
  value_type local_178;
  allocator<wchar_t> local_151;
  value_type local_150;
  int local_130;
  allocator<wchar_t> local_12a;
  allocator<wchar_t> local_129;
  int c2;
  undefined4 local_108;
  allocator<wchar_t> local_101;
  wstring local_100;
  ulong local_e0;
  size_t i;
  uint local_d0;
  int dataIndex;
  int dataPosition;
  wchar_t local_c0;
  wchar_t local_bc;
  wchar_t dataVal;
  wchar_t c;
  int power;
  int maxpower;
  int resb;
  int bits;
  wstring w;
  wstring result;
  wstring entry;
  int numBits;
  int enLargeIn;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  dict;
  GetNextCharFunc *func_local;
  int resetValue_local;
  int length_local;
  LZString *this_local;
  
  dict.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)&numBits);
  entry.field_2._M_local_buf[3] = L'\x04';
  entry.field_2._M_local_buf[2] = L'\x03';
  std::__cxx11::wstring::wstring((wstring *)((long)&result.field_2 + 8));
  std::__cxx11::wstring::wstring((wstring *)((long)&w.field_2 + 8));
  std::__cxx11::wstring::wstring((wstring *)&resb);
  maxpower = 0;
  local_bc = L'\0';
  local_c0 = std::function<wchar_t_(int)>::operator()(func,0);
  i._4_4_ = 1;
  local_d0 = resetValue;
  for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
    std::__cxx11::to_wstring(&local_100,local_e0);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)&numBits,&local_100);
    std::__cxx11::wstring::~wstring((wstring *)&local_100);
  }
  dVar6 = pow(2.0,2.0);
  c = (wchar_t)dVar6;
  for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
    power = local_c0 & local_d0;
    local_d0 = (int)local_d0 >> 1;
    if (local_d0 == 0) {
      i._4_4_ = i._4_4_ + 1;
      local_d0 = resetValue;
      local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
    }
    maxpower = (uint)(0 < power) * dataVal | maxpower;
  }
  if (maxpower == 0) {
    maxpower = 0;
    dVar6 = pow(2.0,8.0);
    c = (wchar_t)dVar6;
    for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
      power = local_c0 & local_d0;
      local_d0 = (int)local_d0 >> 1;
      if (local_d0 == 0) {
        i._4_4_ = i._4_4_ + 1;
        local_d0 = resetValue;
        local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
      }
      maxpower = (uint)(0 < power) * dataVal | maxpower;
    }
    local_bc = maxpower;
  }
  else if (maxpower == 1) {
    maxpower = 0;
    dVar6 = pow(2.0,16.0);
    c = (wchar_t)dVar6;
    for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
      power = local_c0 & local_d0;
      local_d0 = (int)local_d0 >> 1;
      if (local_d0 == 0) {
        i._4_4_ = i._4_4_ + 1;
        local_d0 = resetValue;
        local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
      }
      maxpower = (uint)(0 < power) * dataVal | maxpower;
    }
    local_bc = maxpower;
  }
  else if (maxpower == 2) {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"",&local_101);
    std::allocator<wchar_t>::~allocator(&local_101);
    goto LAB_0011dd9d;
  }
  __c = local_bc;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&c2,1,__c,&local_129);
  std::__cxx11::wstring::operator=((wstring *)&resb,(wstring *)&c2);
  std::__cxx11::wstring::~wstring((wstring *)&c2);
  std::allocator<wchar_t>::~allocator(&local_129);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)&numBits,(value_type *)&resb);
  std::__cxx11::wstring::push_back((int)&w + L'\x18');
  while (i._4_4_ <= length) {
    maxpower = 0;
    dVar6 = pow(2.0,(double)entry.field_2._M_local_buf[2]);
    c = (wchar_t)dVar6;
    for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
      power = local_c0 & local_d0;
      local_d0 = (int)local_d0 >> 1;
      if (local_d0 == 0) {
        i._4_4_ = i._4_4_ + 1;
        local_d0 = resetValue;
        local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
      }
      maxpower = (uint)(0 < power) * dataVal | maxpower;
    }
    local_130 = maxpower;
    if (maxpower == 0) {
      maxpower = 0;
      dVar6 = pow(2.0,8.0);
      c = (wchar_t)dVar6;
      for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
        power = local_c0 & local_d0;
        local_d0 = (int)local_d0 >> 1;
        if (local_d0 == 0) {
          i._4_4_ = i._4_4_ + 1;
          local_d0 = resetValue;
          local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
        }
        maxpower = (uint)(0 < power) * dataVal | maxpower;
      }
      sVar2 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      *)&numBits);
      iVar1 = maxpower;
      local_130 = (int)sVar2;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_150,1,iVar1,&local_151);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&numBits,&local_150);
      std::__cxx11::wstring::~wstring((wstring *)&local_150);
      std::allocator<wchar_t>::~allocator(&local_151);
      entry.field_2._M_local_buf[3] = entry.field_2._M_local_buf[3] + L'\xffffffff';
    }
    else if (maxpower == 1) {
      maxpower = 0;
      dVar6 = pow(2.0,16.0);
      c = (wchar_t)dVar6;
      for (dataVal = L'\x01'; iVar1 = i._4_4_, dataVal != c; dataVal = dataVal << 1) {
        power = local_c0 & local_d0;
        local_d0 = (int)local_d0 >> 1;
        if (local_d0 == 0) {
          i._4_4_ = i._4_4_ + 1;
          local_d0 = resetValue;
          local_c0 = std::function<wchar_t_(int)>::operator()(func,iVar1);
        }
        maxpower = (uint)(0 < power) * dataVal | maxpower;
      }
      sVar2 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      *)&numBits);
      iVar1 = maxpower;
      local_130 = (int)sVar2;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_178,1,iVar1,&local_179);
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&numBits,&local_178);
      std::__cxx11::wstring::~wstring((wstring *)&local_178);
      std::allocator<wchar_t>::~allocator(&local_179);
      entry.field_2._M_local_buf[3] = entry.field_2._M_local_buf[3] + L'\xffffffff';
    }
    else if (maxpower == 2) {
      std::__cxx11::wstring::wstring
                ((wstring *)__return_storage_ptr__,(wstring *)((long)&w.field_2 + 8));
      goto LAB_0011dd9d;
    }
    if (entry.field_2._M_local_buf[3] == L'\0') {
      dVar6 = pow(2.0,(double)entry.field_2._M_local_buf[2]);
      entry.field_2._M_local_buf[3] = (wchar_t)dVar6;
      entry.field_2._M_local_buf[2] = entry.field_2._M_local_buf[2] + L'\x01';
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)&numBits);
    if (sVar2 - 1 < (ulong)(long)local_130) {
      sVar2 = (size_type)local_130;
      sVar4 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      *)&numBits);
      if (sVar2 != sVar4) {
        std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
        goto LAB_0011dd9d;
      }
      pwVar5 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)&resb);
      std::operator+(&local_1a0,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &resb,*pwVar5);
      std::__cxx11::wstring::operator=((wstring *)((long)&result.field_2 + 8),(wstring *)&local_1a0)
      ;
      std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                             *)&numBits,(long)local_130);
      std::__cxx11::wstring::operator=((wstring *)((long)&result.field_2 + 8),(wstring *)pvVar3);
    }
    std::__cxx11::wstring::operator+=
              ((wstring *)((long)&w.field_2 + 8),(wstring *)((long)&result.field_2 + 8));
    pwVar5 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)((long)&result.field_2 + 8));
    std::operator+(&local_1c0,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &resb,*pwVar5);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)&numBits,&local_1c0);
    std::__cxx11::wstring::~wstring((wstring *)&local_1c0);
    entry.field_2._M_local_buf[3] = entry.field_2._M_local_buf[3] + L'\xffffffff';
    std::__cxx11::wstring::operator=((wstring *)&resb,(wstring *)((long)&result.field_2 + 8));
    if (entry.field_2._M_local_buf[3] == L'\0') {
      dVar6 = pow(2.0,(double)entry.field_2._M_local_buf[2]);
      entry.field_2._M_local_buf[3] = (wchar_t)dVar6;
      entry.field_2._M_local_buf[2] = entry.field_2._M_local_buf[2] + L'\x01';
    }
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"",&local_12a);
  std::allocator<wchar_t>::~allocator(&local_12a);
LAB_0011dd9d:
  local_108 = 1;
  std::__cxx11::wstring::~wstring((wstring *)&resb);
  std::__cxx11::wstring::~wstring((wstring *)((long)&w.field_2 + 8));
  std::__cxx11::wstring::~wstring((wstring *)((long)&result.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&numBits);
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompress(const int length, const int resetValue, GetNextCharFunc func)
{
	std::vector<std::wstring> dict;
	int enLargeIn = 4;
	int numBits = 3;
	std::wstring entry;
	std::wstring result;
	std::wstring w;
	int bits = 0, resb, maxpower, power;
	wchar_t c = '\0';

	wchar_t dataVal = func(0);
	int dataPosition = resetValue;
	int dataIndex = 1;

	for (size_t i = 0; i < 3; i++)
	{
		dict.push_back(std::to_wstring(i));
	}

	maxpower = (int)pow(2, 2);
	power = 1;
	while (power != maxpower)
	{
		resb = dataVal & dataPosition;
		dataPosition >>= 1;
		if (dataPosition == 0)
		{
			dataPosition = resetValue;
			dataVal = func(dataIndex++);
		}
		bits |= (resb > 0 ? 1 : 0) * power;
		power <<= 1;
	}

	switch (bits)
	{
	case 0:
		bits = 0;
		maxpower = (int)pow(2, 8);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 1:
		bits = 0;
		maxpower = (int)pow(2, 16);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 2:
		return L"";
	}
	w = std::wstring(1, c);
	dict.push_back(w);
	result.push_back(c);
	while (true)
	{
		if (dataIndex > length)
		{
			return L"";
		}

		bits = 0;
		maxpower = (int)pow(2, numBits);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}

		int c2;
		switch (c2 = bits)
		{
		case (wchar_t)0:
			bits = 0;
			maxpower = (int)pow(2, 8);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)1:
			bits = 0;
			maxpower = (int)pow(2, 16);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)2:
			return result;
		}

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}

		if (dict.size() - 1 >= c2)
		{
			entry = dict[c2];
		}
		else
		{
			if (c2 == dict.size())
			{
				entry = w + w[0];
			}
			else
			{
				return std::wstring();
			}
		}

		result += entry;

		// Add w+entry[0] to the dictionary
		dict.push_back(w + entry[0]);
		enLargeIn--;

		w = entry;

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}
	}
}